

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O1

void GetVert(Level *NewLev,Triangle *t,int c)

{
  byte *pbVar1;
  Vertex *pVVar2;
  int iVar3;
  int Finished;
  ulong uVar4;
  bool bVar5;
  
  ExpectToken(TK_OPENBRACE);
  ExpectToken(TK_NUMBER);
  iVar3 = Token.IQuantity;
  uVar4 = (ulong)(uint)c;
  pVVar2 = NewLev->AllVerts;
  t->Edges[uVar4] = pVVar2;
  while (pVVar2 != (Vertex *)0x0) {
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) {
      Token.IQuantity = -1;
      break;
    }
    pVVar2 = pVVar2->Next;
    t->Edges[uVar4] = pVVar2;
    Token.IQuantity = iVar3;
  }
  if (Token.IQuantity != -1) {
    Error = 1;
    snprintf(ErrorText,0x400,"Unknown vertex referenced at line %d",(ulong)(uint)Lines);
    return;
  }
  ExpectToken(TK_COMMA);
  ExpectToken(TK_NUMBER);
  t->EdgeFlags[uVar4] = (screen_height * Token.IQuantity) / 0x1e0;
  GetToken();
  if (Token.Type != TK_CLOSEBRACE) {
    if (Token.Type == TK_COMMA) {
      bVar5 = false;
      do {
        GetToken();
        if (Token.Type == TK_CLOSEBRACE) {
          bVar5 = true;
        }
        else {
          if (Token.Type != TK_STRING) goto LAB_0010d928;
          if (Token.Text[4] == '\0' && Token.Text._0_4_ == 0x65676465) {
            *(byte *)(t->EdgeFlags + uVar4) = (byte)t->EdgeFlags[uVar4] | 0x80;
          }
          if (CONCAT35(Token.Text._8_3_,CONCAT41(Token.Text._4_4_,Token.Text[3])) ==
              0x656c626164696c && CONCAT44(Token.Text._4_4_,Token.Text._0_4_) == 0x626164696c6c6f63)
          {
            pbVar1 = (byte *)((long)t->EdgeFlags + uVar4 * 4 + 1);
            *pbVar1 = *pbVar1 | 1;
          }
          if (CONCAT35(Token.Text._8_3_,CONCAT41(Token.Text._4_4_,Token.Text[3])) ==
              0x646e756f726765 && CONCAT44(Token.Text._4_4_,Token.Text._0_4_) == 0x756f726765726f66)
          {
            pbVar1 = (byte *)((long)t->EdgeFlags + uVar4 * 4 + 1);
            *pbVar1 = *pbVar1 | 2;
          }
        }
      } while (!bVar5);
    }
    else {
LAB_0010d928:
      Error = 1;
    }
  }
  return;
}

Assistant:

static void GetVert(struct Level *NewLev, struct Triangle *t, int c)
{
   ExpectToken(TK_OPENBRACE);

   ExpectToken(TK_NUMBER);
   t->Edges[c] = NewLev->AllVerts;
   while (t->Edges[c] && Token.IQuantity--)
      t->Edges[c] = t->Edges[c]->Next;

   if (Token.IQuantity != -1) {
      Error = 1;
      snprintf(ErrorText, sizeof(ErrorText),
                "Unknown vertex referenced at line %d", Lines);
      return;
   }
   ExpectToken(TK_COMMA);

   ExpectToken(TK_NUMBER);
   t->EdgeFlags[c] = (Token.IQuantity * screen_height) / 480;

   GetToken();
   switch (Token.Type) {
      case TK_COMMA:
         {
            int Finished = false;

            while (!Finished) {
               GetToken();
               switch (Token.Type) {
                  case TK_CLOSEBRACE:
                     Finished = true;
                     break;
                  case TK_STRING:
                     if (!strcmp(Token.Text, "edge"))
                        t->EdgeFlags[c] |= TRIFLAGS_EDGE;
                     if (!strcmp(Token.Text, "collidable"))
                        t->EdgeFlags[c] |= FLAGS_COLLIDABLE;
                     if (!strcmp(Token.Text, "foreground"))
                        t->EdgeFlags[c] |= FLAGS_FOREGROUND;
                     break;
                  default:
                     Error = 1;
                     return;
               }
            }
         }
         break;
      case TK_CLOSEBRACE:
         break;
      default:
         Error = 1;
         return;
   }
}